

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

_Bool GPU_IntersectRect(GPU_Rect A,GPU_Rect B,GPU_Rect *result)

{
  undefined1 auVar1 [16];
  _Bool _Var2;
  undefined4 in_EAX;
  int iVar3;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar4._0_8_ = B._0_8_;
  auVar4._8_8_ = B._0_8_;
  auVar5._4_4_ = -(uint)(A.h <= 0.0);
  auVar5._0_4_ = -(uint)(A.w <= 0.0);
  auVar5._8_4_ = -(uint)(B.w <= 0.0);
  auVar5._12_4_ = -(uint)(B.h <= 0.0);
  iVar3 = movmskps(in_EAX,auVar5);
  if (iVar3 == 0) {
    auVar6._0_4_ = B.w + B.x;
    auVar6._4_4_ = B.h + B.y;
    auVar6._8_4_ = B.w + B.x;
    auVar6._12_4_ = B.h + B.y;
    auVar7._4_4_ = A.h + A.y;
    auVar7._0_4_ = A.w + A.x;
    auVar7._8_4_ = in_XMM1_Dc + in_XMM0_Dc;
    auVar7._12_4_ = in_XMM1_Dd + in_XMM0_Dd;
    auVar7 = minps(auVar6,auVar7);
    auVar1._8_4_ = in_XMM0_Dc;
    auVar1._0_8_ = A._0_8_;
    auVar1._12_4_ = in_XMM0_Dd;
    auVar5 = maxps(auVar4,auVar1);
    _Var2 = false;
    if (auVar5._0_4_ < auVar7._0_4_) {
      if ((auVar5._4_4_ < auVar7._4_4_) && (_Var2 = true, result != (GPU_Rect *)0x0)) {
        result->x = (float)(int)auVar5._0_8_;
        result->y = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
        result->w = auVar7._0_4_ - auVar5._0_4_;
        result->h = auVar7._4_4_ - auVar5._4_4_;
        return _Var2;
      }
    }
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

GPU_bool GPU_IntersectRect(GPU_Rect A, GPU_Rect B, GPU_Rect* result)
{
    GPU_bool has_horiz_intersection = GPU_FALSE;
    float Amin, Amax, Bmin, Bmax;
    GPU_Rect intersection;

    // Special case for empty rects
    if (A.w <= 0.0f || A.h <= 0.0f || B.w <= 0.0f || B.h <= 0.0f)
        return GPU_FALSE;

    // Horizontal intersection
    Amin = A.x;
    Amax = Amin + A.w;
    Bmin = B.x;
    Bmax = Bmin + B.w;
    if (Bmin > Amin)
        Amin = Bmin;
    if (Bmax < Amax)
        Amax = Bmax;
    
    intersection.x = Amin;
    intersection.w = Amax - Amin;
    
    has_horiz_intersection = (Amax > Amin);

    // Vertical intersection
    Amin = A.y;
    Amax = Amin + A.h;
    Bmin = B.y;
    Bmax = Bmin + B.h;
    if (Bmin > Amin)
        Amin = Bmin;
    if (Bmax < Amax)
        Amax = Bmax;
    
    intersection.y = Amin;
    intersection.h = Amax - Amin;
    
    if(has_horiz_intersection && Amax > Amin)
    {
        if(result != NULL)
            *result = intersection;
        return GPU_TRUE;
    }
    else
        return GPU_FALSE;
}